

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O2

int kex_session_ecdh_curve_type(char *name,libssh2_curve_type *out_type)

{
  int iVar1;
  int iVar2;
  libssh2_curve_type lVar3;
  bool bVar4;
  
  if (name == (char *)0x0) {
    iVar2 = -1;
  }
  else {
    iVar1 = strcmp(name,"ecdh-sha2-nistp256");
    iVar2 = 0;
    bVar4 = true;
    if (iVar1 == 0) {
      lVar3 = LIBSSH2_EC_CURVE_NISTP256;
    }
    else {
      iVar1 = strcmp(name,"ecdh-sha2-nistp384");
      if (iVar1 == 0) {
        lVar3 = LIBSSH2_EC_CURVE_NISTP384;
      }
      else {
        iVar2 = strcmp(name,"ecdh-sha2-nistp521");
        bVar4 = iVar2 == 0;
        iVar2 = -(uint)!bVar4;
        lVar3 = LIBSSH2_EC_CURVE_NISTP521;
      }
    }
    if (!(bool)(bVar4 ^ 1U | out_type == (libssh2_curve_type *)0x0)) {
      *out_type = lVar3;
    }
  }
  return iVar2;
}

Assistant:

static int
kex_session_ecdh_curve_type(const char *name, libssh2_curve_type *out_type)
{
    int ret = 0;
    libssh2_curve_type type;

    if(!name)
        return -1;

    if(strcmp(name, "ecdh-sha2-nistp256") == 0)
        type = LIBSSH2_EC_CURVE_NISTP256;
    else if(strcmp(name, "ecdh-sha2-nistp384") == 0)
        type = LIBSSH2_EC_CURVE_NISTP384;
    else if(strcmp(name, "ecdh-sha2-nistp521") == 0)
        type = LIBSSH2_EC_CURVE_NISTP521;
    else {
/* silence:
   warning C4701: potentially uninitialized local variable 'type' used */
#if defined(_MSC_VER)
        type = (libssh2_curve_type)0;
#endif
        ret = -1;
    }

    if(ret == 0 && out_type) {
        *out_type = type;
    }

    return ret;
}